

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_ManSatSolveSeq_rec
               (Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vInfo,int iPat,int nRegs)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  pGVar4 = p->pObjs;
  if (pGVar4 <= pObj) {
    do {
      if (pGVar4 + p->nObjs <= pObj) break;
      iVar5 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar5) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar5] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar5] = p->nTravIds;
      uVar2 = (uint)*(undefined8 *)pObj;
      if ((~uVar2 & 0x9fffffff) == 0) {
        uVar2 = ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) + nRegs;
        if ((-1 < (int)uVar2) && ((int)uVar2 < vInfo->nSize)) {
          pvVar1 = vInfo->pArray[uVar2];
          uVar3 = Cec_ObjSatVarValue(pSat,pObj);
          uVar2 = *(uint *)((long)pvVar1 + (long)(iPat >> 5) * 4);
          if (uVar3 != ((uVar2 >> (iPat & 0x1fU) & 1) != 0)) {
            *(uint *)((long)pvVar1 + (long)(iPat >> 5) * 4) = uVar2 ^ 1 << (iPat & 0x1fU);
          }
          pSat->nCexLits = pSat->nCexLits + 1;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                      ,0x37b,
                      "void Cec_ManSatSolveSeq_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, int, int)"
                     );
      }
      Cec_ManSatSolveSeq_rec(pSat,p,pObj + -(ulong)(uVar2 & 0x1fffffff),vInfo,iPat,nRegs);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar4 = p->pObjs;
    } while (pGVar4 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManSatSolveSeq_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vInfo, int iPat, int nRegs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        unsigned * pInfo = (unsigned *)Vec_PtrEntry( vInfo, nRegs + Gia_ObjCioId(pObj) );
        if ( Cec_ObjSatVarValue( pSat, pObj ) != Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoXorBit( pInfo, iPat );
        pSat->nCexLits++;
//        Vec_IntPush( pSat->vCex, Abc_Var2Lit( Gia_ObjCioId(pObj), !Cec_ObjSatVarValue(pSat, pObj) ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin0(pObj), vInfo, iPat, nRegs );
    Cec_ManSatSolveSeq_rec( pSat, p, Gia_ObjFanin1(pObj), vInfo, iPat, nRegs );
}